

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O1

void ot::commissioner::DtlsSession::DtlsTimer::SetDelay
               (void *aDtlsTimer,uint32_t aIntermediate,uint32_t aFinish)

{
  long lVar1;
  
  if (aFinish == 0) {
    *(undefined1 *)((long)aDtlsTimer + 0xb8) = 1;
    if (*(char *)((long)aDtlsTimer + 0xa9) == '\x01') {
      event_del((event *)aDtlsTimer);
    }
    *(undefined1 *)((long)aDtlsTimer + 0xa9) = 0;
  }
  else {
    *(undefined1 *)((long)aDtlsTimer + 0xb8) = 0;
    lVar1 = std::chrono::_V2::system_clock::now();
    Timer::Start((Timer *)aDtlsTimer,(TimePoint)((ulong)aFinish * 1000000 + lVar1));
    lVar1 = std::chrono::_V2::system_clock::now();
    *(ulong *)((long)aDtlsTimer + 0xb0) = (ulong)aIntermediate * 1000000 + lVar1;
  }
  return;
}

Assistant:

void DtlsSession::DtlsTimer::SetDelay(void *aDtlsTimer, uint32_t aIntermediate, uint32_t aFinish)
{
    auto timer = reinterpret_cast<DtlsTimer *>(aDtlsTimer);

    if (aFinish == 0)
    {
        timer->mCancelled = true;
        timer->Stop();
    }
    else
    {
        timer->mCancelled = false;
        timer->Start(std::chrono::milliseconds(aFinish));
        timer->mIntermediate = Clock::now() + std::chrono::milliseconds(aIntermediate);
    }
}